

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O2

void __thiscall flatbuffers::ts::TsGenerator::generateEnums(TsGenerator *this)

{
  EnumDef *enum_def;
  Parser *pPVar1;
  pointer ppEVar2;
  string enumcode;
  import_set bare_imports;
  import_set imports;
  string type_name;
  string local_50;
  
  pPVar1 = (this->super_BaseGenerator).parser_;
  for (ppEVar2 = (pPVar1->enums_).vec.
                 super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppEVar2 !=
      (pPVar1->enums_).vec.
      super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar2 = ppEVar2 + 1) {
    bare_imports._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    bare_imports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    bare_imports._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &bare_imports._M_t._M_impl.super__Rb_tree_header._M_header;
    bare_imports._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    imports._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    imports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    imports._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &imports._M_t._M_impl.super__Rb_tree_header._M_header;
    imports._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    enumcode._M_dataplus._M_p = (pointer)&enumcode.field_2;
    enumcode._M_string_length = 0;
    enumcode.field_2._M_local_buf[0] = '\0';
    enum_def = *ppEVar2;
    bare_imports._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         bare_imports._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    imports._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         imports._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    GenEnum(this,enum_def,&enumcode,&imports,false);
    GenEnum(this,enum_def,&enumcode,&imports,true);
    (*(this->namer_).super_Namer._vptr_Namer[0xf])(&type_name,&this->namer_,enum_def);
    std::__cxx11::string::string((string *)&local_50,(string *)&type_name);
    TrackNsDef(this,&enum_def->super_Definition,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    SaveType(this,&enum_def->super_Definition,&enumcode,&imports,&bare_imports);
    std::__cxx11::string::~string((string *)&type_name);
    std::__cxx11::string::~string((string *)&enumcode);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
    ::~map(&imports);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
    ::~map(&bare_imports);
    pPVar1 = (this->super_BaseGenerator).parser_;
  }
  return;
}

Assistant:

void generateEnums() {
    for (auto it = parser_.enums_.vec.begin(); it != parser_.enums_.vec.end();
         ++it) {
      import_set bare_imports;
      import_set imports;
      std::string enumcode;
      auto &enum_def = **it;
      GenEnum(enum_def, &enumcode, imports, false);
      GenEnum(enum_def, &enumcode, imports, true);
      std::string type_name = GetTypeName(enum_def);
      TrackNsDef(enum_def, type_name);
      SaveType(enum_def, enumcode, imports, bare_imports);
    }
  }